

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzpolynomial.cpp
# Opt level: O3

void __thiscall TPZPolynomial::TPZPolynomial(TPZPolynomial *this,TPZVec<double> *coef)

{
  TPZVec<double>::TPZVec(&this->fCo,4);
  TPZVec<double>::TPZVec(&this->fReal,3);
  this->fImagem = 0.0;
  SetCoef(this,coef);
  return;
}

Assistant:

TPZPolynomial::TPZPolynomial(const TPZVec<REAL> &coef): fCo(4), fReal(3), fImagem(0.0) {
    SetCoef(coef);
}